

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlareState.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::FlareState::Decode(FlareState *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x1f < KVar1) {
    KDataStream::Read<unsigned_int>(stream,&(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
    KDataStream::Read<unsigned_short>(stream,&(this->super_EnvironmentRecord).m_ui16Length);
    KDataStream::Read(stream,&(this->super_EnvironmentRecord).m_ui8Index);
    KDataStream::Read(stream,&(this->super_EnvironmentRecord).m_ui8Padding);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32TSC);
    (*(this->m_Src).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Src,stream);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32NumInt);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32NumSrcs);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16GeometryIndex);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void FlareState::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < FLARE_STATE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32EnvRecTyp
           >> m_ui16Length
           >> m_ui8Index
           >> m_ui8Padding
           >> m_ui32TSC
           >> KDIS_STREAM m_Src
           >> m_ui32NumInt
           >> m_ui32NumSrcs
           >> m_ui16GeometryIndex
           >> m_ui16Padding;
}